

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

void node::ImportBlocks(ChainstateManager *chainman,
                       span<const_fs::path,_18446744073709551615UL> import_paths)

{
  ConstevalStringLiteral str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  ConstevalFormatString<1U> CVar1;
  BlockManager *pBVar2;
  bool bVar3;
  undefined1 uVar4;
  byte bVar5;
  iterator this;
  iterator state_00;
  reference __filename;
  FILE *pFVar6;
  Notifications *pNVar7;
  long in_FS_OFFSET;
  Chainstate *chainstate;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range1_1;
  path *path;
  span<const_fs::path,_18446744073709551615UL> *__range1;
  int nFile;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  FlatFilePos pos;
  ImportingNow imp;
  AutoFile file_1;
  AutoFile file;
  BlockValidationState state;
  multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
  blocks_with_unknown_parent;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  char *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  atomic<bool> *in_stack_fffffffffffffbc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbc8;
  anon_class_8_1_3d09f077 *in_stack_fffffffffffffbd0;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffbe0;
  FILE *in_stack_fffffffffffffbe8;
  ValidationState<BlockValidationResult> *this_00;
  AutoFile *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  ChainstateManager *in_stack_fffffffffffffc00;
  undefined6 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0e;
  undefined1 in_stack_fffffffffffffc0f;
  LogFlags in_stack_fffffffffffffc10;
  undefined8 *flag;
  undefined8 in_stack_fffffffffffffc18;
  int iVar8;
  ConstevalFormatString<1U> in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  BlockManager *in_stack_fffffffffffffc68;
  Chainstate *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  char *pcVar9;
  int local_368;
  int local_354;
  Level in_stack_fffffffffffffd50;
  undefined8 local_2a8;
  char (*in_stack_fffffffffffffd60) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  shared_ptr<const_CBlock> *in_stack_fffffffffffffd70;
  undefined1 local_22c [108];
  multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
  *in_stack_fffffffffffffe40;
  FlatFilePos *in_stack_fffffffffffffe48;
  AutoFile *in_stack_fffffffffffffe50;
  ChainstateManager *in_stack_fffffffffffffe58;
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ImportingNow::ImportingNow
            ((ImportingNow *)in_stack_fffffffffffffbb8,(atomic<bool> *)in_stack_fffffffffffffbb0);
  bVar3 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffbc0);
  if (!bVar3) {
    local_354 = 0;
    std::
    multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
    ::multimap((multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    do {
      FlatFilePos::FlatFilePos
                ((FlatFilePos *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),0,
                 0x37d2fa);
      BlockManager::GetBlockPosFilename
                ((BlockManager *)in_stack_fffffffffffffbb0,
                 (FlatFilePos *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      bVar3 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      iVar8 = (int)((ulong)in_stack_fffffffffffffc18 >> 0x20);
      if (((bVar3 ^ 0xffU) & 1) != 0) goto LAB_0037d618;
      BlockManager::OpenBlockFile
                ((BlockManager *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (FlatFilePos *)in_stack_fffffffffffffbf0,
                 SUB81((ulong)in_stack_fffffffffffffbe8 >> 0x38,0));
      bVar3 = AutoFile::IsNull((AutoFile *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      if (bVar3) {
        local_368 = 3;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
        local_22c._0_4_ = local_354;
        in_stack_fffffffffffffbb8 = local_22c;
        in_stack_fffffffffffffbb0 = "Reindexing block file blk%05u.dat...\n";
        in_stack_fffffffffffffba8 = 2;
        logging_function._M_str = in_stack_fffffffffffffc78;
        logging_function._M_len = (size_t)in_stack_fffffffffffffc70;
        source_file._M_str = (char *)in_stack_fffffffffffffc68;
        source_file._M_len = (size_t)in_stack_fffffffffffffc60;
        LogPrintFormatInternal<unsigned_int>
                  (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,in_stack_fffffffffffffd50,in_stack_fffffffffffffc58,
                   (uint *)in_stack_fffffffffffffd60);
        ChainstateManager::LoadExternalBlockFile
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe40);
        bVar3 = util::SignalInterrupt::operator_cast_to_bool
                          ((SignalInterrupt *)
                           CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        if (bVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
          in_stack_fffffffffffffbb8 = "ImportBlocks";
          in_stack_fffffffffffffbb0 = "Interrupt requested. Exit %s\n";
          in_stack_fffffffffffffba8 = 2;
          logging_function_00._M_str = in_stack_fffffffffffffc78;
          logging_function_00._M_len = (size_t)in_stack_fffffffffffffc70;
          source_file_00._M_str = (char *)in_stack_fffffffffffffc68;
          source_file_00._M_len = (size_t)in_stack_fffffffffffffc60;
          LogPrintFormatInternal<char[13]>
                    (logging_function_00,source_file_00,
                     (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),in_stack_fffffffffffffc10,
                     in_stack_fffffffffffffd50,in_stack_fffffffffffffc58,in_stack_fffffffffffffd60);
          local_368 = 1;
        }
        else {
          local_354 = local_354 + 1;
          local_368 = 0;
        }
      }
      AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
      ;
      iVar8 = (int)((ulong)in_stack_fffffffffffffc18 >> 0x20);
    } while (local_368 == 0);
    if (local_368 == 3) {
LAB_0037d618:
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      ImportBlocks::anon_class_8_1_3d09f077::operator()
                ((anon_class_8_1_3d09f077 *)in_stack_fffffffffffffbc8);
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),false
                );
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffbb0 = "Reindexing finished\n";
      in_stack_fffffffffffffba8 = 2;
      logging_function_01._M_str = in_stack_fffffffffffffc78;
      logging_function_01._M_len = (size_t)in_stack_fffffffffffffc70;
      source_file_01._M_str = (char *)in_stack_fffffffffffffc68;
      source_file_01._M_len = (size_t)in_stack_fffffffffffffc60;
      LogPrintFormatInternal<>
                (logging_function_01,source_file_01,iVar8,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffd50,(ConstevalFormatString<0U>)in_stack_fffffffffffffc58.fmt)
      ;
      ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffffbb8);
      Chainstate::LoadGenesisBlock(in_stack_fffffffffffffc70);
      local_368 = 0;
    }
    std::
    multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
    ::~multimap((multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                 *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    if (local_368 != 0) goto LAB_0037de9e;
  }
  pcVar9 = local_22c + 0x34;
  this = std::span<const_fs::path,_18446744073709551615UL>::begin
                   ((span<const_fs::path,_18446744073709551615UL> *)in_stack_fffffffffffffbb0);
  state_00 = std::span<const_fs::path,_18446744073709551615UL>::end
                       ((span<const_fs::path,_18446744073709551615UL> *)in_stack_fffffffffffffbb8);
  while (bVar3 = __gnu_cxx::
                 operator==<const_fs::path_*,_std::span<const_fs::path,_18446744073709551615UL>_>
                           ((__normal_iterator<const_fs::path_*,_std::span<const_fs::path,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffbb8,
                            (__normal_iterator<const_fs::path_*,_std::span<const_fs::path,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffbb0), ((bVar3 ^ 0xffU) & 1) != 0) {
    __filename = __gnu_cxx::
                 __normal_iterator<const_fs::path_*,_std::span<const_fs::path,_18446744073709551615UL>_>
                 ::operator*((__normal_iterator<const_fs::path_*,_std::span<const_fs::path,_18446744073709551615UL>_>
                              *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    pFVar6 = fsbridge::fopen((char *)__filename,"rb");
    iVar8 = (int)((ulong)pFVar6 >> 0x20);
    local_2a8 = 0;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    flag = &local_2a8;
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    AutoFile::AutoFile(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0
                      );
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffbb8);
    in_stack_fffffffffffffc0f =
         AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
    ;
    if ((bool)in_stack_fffffffffffffc0f) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      CVar1.fmt = "Warning: Could not open blocks file %s\n";
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffbb0 = CVar1.fmt;
      in_stack_fffffffffffffbb8 = local_a0;
      in_stack_fffffffffffffba8 = 2;
      logging_function_04._M_str = pcVar9;
      logging_function_04._M_len = (size_t)__filename;
      source_file_04._M_str = (char *)in_stack_fffffffffffffc68;
      source_file_04._M_len = (size_t)in_stack_fffffffffffffc60;
      in_stack_fffffffffffffc58.fmt = in_stack_fffffffffffffbb0;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_04,source_file_04,iVar8,(LogFlags)flag,in_stack_fffffffffffffd50,
                 (ConstevalFormatString<1U>)in_stack_fffffffffffffbb0,args);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
LAB_0037db34:
      bVar3 = false;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      pBVar2 = (BlockManager *)"Importing blocks file %s...\n";
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffbb0 = (char *)pBVar2;
      in_stack_fffffffffffffbb8 = local_a0 + 0x20;
      in_stack_fffffffffffffba8 = 2;
      logging_function_02._M_str = pcVar9;
      logging_function_02._M_len = (size_t)__filename;
      source_file_02._M_str = in_stack_fffffffffffffbb0;
      source_file_02._M_len = (size_t)in_stack_fffffffffffffc60;
      in_stack_fffffffffffffc68 = (BlockManager *)in_stack_fffffffffffffbb0;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_02,source_file_02,iVar8,(LogFlags)flag,in_stack_fffffffffffffd50,
                 in_stack_fffffffffffffc58,args);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      ChainstateManager::LoadExternalBlockFile
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe40);
      in_stack_fffffffffffffc0e =
           util::SignalInterrupt::operator_cast_to_bool
                     ((SignalInterrupt *)
                      CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      if (!(bool)in_stack_fffffffffffffc0e) goto LAB_0037db34;
      in_stack_fffffffffffffbb8 = "ImportBlocks";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffc60 = "Interrupt requested. Exit %s\n";
      in_stack_fffffffffffffbb0 = "Interrupt requested. Exit %s\n";
      in_stack_fffffffffffffba8 = 2;
      logging_function_03._M_str = pcVar9;
      logging_function_03._M_len = (size_t)__filename;
      source_file_03._M_str = (char *)in_stack_fffffffffffffc68;
      source_file_03._M_len = (size_t)"Interrupt requested. Exit %s\n";
      in_stack_fffffffffffffc00 = (ChainstateManager *)in_stack_fffffffffffffbb8;
      LogPrintFormatInternal<char[13]>
                (logging_function_03,source_file_03,iVar8,(LogFlags)flag,in_stack_fffffffffffffd50,
                 in_stack_fffffffffffffc58,(char (*) [13])args);
      bVar3 = true;
    }
    AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    if (bVar3) goto LAB_0037de9e;
    __gnu_cxx::
    __normal_iterator<const_fs::path_*,_std::span<const_fs::path,_18446744073709551615UL>_>::
    operator++((__normal_iterator<const_fs::path_*,_std::span<const_fs::path,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  ImportBlocks::anon_class_8_1_3d09f077::operator()(in_stack_fffffffffffffbd0);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffbb0);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffbb0);
  while (bVar3 = __gnu_cxx::
                 operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                           ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)in_stack_fffffffffffffbb8,
                            (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)in_stack_fffffffffffffbb0), ((bVar3 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>::
    operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
               *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    this_00 = (ValidationState<BlockValidationResult> *)&stack0xffffffffffffff18;
    BlockValidationState::BlockValidationState
              ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
              );
    std::shared_ptr<const_CBlock>::shared_ptr
              ((shared_ptr<const_CBlock> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),(nullptr_t)0x37dc6a);
    uVar4 = Chainstate::ActivateBestChain
                      ((Chainstate *)this._M_current,(BlockValidationState *)state_00._M_current,
                       in_stack_fffffffffffffd70);
    bVar5 = uVar4 ^ 0xff;
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    bVar3 = (bVar5 & 1) != 0;
    if (bVar3) {
      pNVar7 = ChainstateManager::GetNotifications
                         ((ChainstateManager *)
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      str.lit._7_1_ = uVar4;
      str.lit._0_7_ = in_stack_fffffffffffffbf8;
      ::_(str);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_(this_00);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)
                 CONCAT17(in_stack_fffffffffffffc0f,
                          CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc00);
      (*pNVar7->_vptr_Notifications[8])(pNVar7,&stack0xfffffffffffffed8);
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    }
    BlockValidationState::~BlockValidationState
              ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
              );
    if (bVar3) break;
    __gnu_cxx::
    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>::
    operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  }
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffbb8);
LAB_0037de9e:
  ImportingNow::~ImportingNow
            ((ImportingNow *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ImportBlocks(ChainstateManager& chainman, std::span<const fs::path> import_paths)
{
    ImportingNow imp{chainman.m_blockman.m_importing};

    // -reindex
    if (!chainman.m_blockman.m_blockfiles_indexed) {
        int nFile = 0;
        // Map of disk positions for blocks with unknown parent (only used for reindex);
        // parent hash -> child disk position, multiple children can have the same parent.
        std::multimap<uint256, FlatFilePos> blocks_with_unknown_parent;
        while (true) {
            FlatFilePos pos(nFile, 0);
            if (!fs::exists(chainman.m_blockman.GetBlockPosFilename(pos))) {
                break; // No block files left to reindex
            }
            AutoFile file{chainman.m_blockman.OpenBlockFile(pos, true)};
            if (file.IsNull()) {
                break; // This error is logged in OpenBlockFile
            }
            LogPrintf("Reindexing block file blk%05u.dat...\n", (unsigned int)nFile);
            chainman.LoadExternalBlockFile(file, &pos, &blocks_with_unknown_parent);
            if (chainman.m_interrupt) {
                LogPrintf("Interrupt requested. Exit %s\n", __func__);
                return;
            }
            nFile++;
        }
        WITH_LOCK(::cs_main, chainman.m_blockman.m_block_tree_db->WriteReindexing(false));
        chainman.m_blockman.m_blockfiles_indexed = true;
        LogPrintf("Reindexing finished\n");
        // To avoid ending up in a situation without genesis block, re-try initializing (no-op if reindexing worked):
        chainman.ActiveChainstate().LoadGenesisBlock();
    }

    // -loadblock=
    for (const fs::path& path : import_paths) {
        AutoFile file{fsbridge::fopen(path, "rb")};
        if (!file.IsNull()) {
            LogPrintf("Importing blocks file %s...\n", fs::PathToString(path));
            chainman.LoadExternalBlockFile(file);
            if (chainman.m_interrupt) {
                LogPrintf("Interrupt requested. Exit %s\n", __func__);
                return;
            }
        } else {
            LogPrintf("Warning: Could not open blocks file %s\n", fs::PathToString(path));
        }
    }

    // scan for better chains in the block chain database, that are not yet connected in the active best chain

    // We can't hold cs_main during ActivateBestChain even though we're accessing
    // the chainman unique_ptrs since ABC requires us not to be holding cs_main, so retrieve
    // the relevant pointers before the ABC call.
    for (Chainstate* chainstate : WITH_LOCK(::cs_main, return chainman.GetAll())) {
        BlockValidationState state;
        if (!chainstate->ActivateBestChain(state, nullptr)) {
            chainman.GetNotifications().fatalError(strprintf(_("Failed to connect best block (%s)."), state.ToString()));
            return;
        }
    }
    // End scope of ImportingNow
}